

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::AddImplicitLinkInfo(cmComputeLinkInformation *this)

{
  bool bVar1;
  LinkClosure *pLVar2;
  pointer __lhs;
  
  pLVar2 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  for (__lhs = (pLVar2->Languages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __lhs != (pLVar2->Languages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
    bVar1 = std::operator!=(__lhs,&this->LinkLanguage);
    if (bVar1) {
      AddImplicitLinkInfo(this,__lhs);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddImplicitLinkInfo()
{
  // The link closure lists all languages whose implicit info is needed.
  cmGeneratorTarget::LinkClosure const* lc =
    this->Target->GetLinkClosure(this->Config);
  for (std::vector<std::string>::const_iterator li = lc->Languages.begin();
       li != lc->Languages.end(); ++li) {
    // Skip those of the linker language.  They are implicit.
    if (*li != this->LinkLanguage) {
      this->AddImplicitLinkInfo(*li);
    }
  }
}